

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::status(torrent *this,torrent_status *st,status_flags_t flags)

{
  sha256_hash *this_00;
  header_holder_type *phVar1;
  uint *puVar2;
  pointer pcVar3;
  peer_list *ppVar4;
  _Map_pointer ppptVar5;
  _Head_base<0UL,_unsigned_int_*,_false> _Var6;
  node_ptr plVar7;
  element_type *peVar8;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_01;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long *plVar16;
  undefined3 uVar17;
  undefined2 uVar18;
  bool bVar19;
  bool bVar20;
  time_point32 tVar21;
  int iVar22;
  seconds32 sVar23;
  uint uVar24;
  undefined4 extraout_var;
  torrent_flags_t tVar25;
  int *piVar26;
  pair<int,_int> pVar27;
  uint uVar28;
  long lVar29;
  int iVar30;
  node_ptr plVar31;
  node_ptr plVar32;
  node_ptr plVar33;
  long lVar34;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  piece_index_t index;
  float fVar35;
  undefined1 local_58 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  tVar21 = time_now32();
  get_handle((torrent *)local_58);
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)st,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  plVar16 = (long *)CONCAT44(local_58._12_4_,local_58._8_4_);
  if (plVar16 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar26 = (int *)((long)plVar16 + 0xc);
      iVar22 = *piVar26;
      *piVar26 = *piVar26 + -1;
      UNLOCK();
    }
    else {
      iVar22 = *(int *)((long)plVar16 + 0xc);
      *(int *)((long)plVar16 + 0xc) = iVar22 + -1;
    }
    if (iVar22 == 1) {
      (**(code **)(*plVar16 + 0x18))();
    }
  }
  (st->info_hashes).v2.m_number._M_elems[7] = (this->m_info_hash).v2.m_number._M_elems[7];
  uVar11 = *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems;
  uVar12 = *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2);
  uVar13 = *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4);
  uVar14 = *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1);
  uVar15 = *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5);
  *(undefined8 *)((st->info_hashes).v2.m_number._M_elems + 3) =
       *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3);
  *(undefined8 *)((st->info_hashes).v2.m_number._M_elems + 5) = uVar15;
  *(undefined8 *)((st->info_hashes).v1.m_number._M_elems + 4) = uVar13;
  *(undefined8 *)((st->info_hashes).v2.m_number._M_elems + 1) = uVar14;
  *(undefined8 *)(st->info_hashes).v1.m_number._M_elems = uVar11;
  *(undefined8 *)((st->info_hashes).v1.m_number._M_elems + 2) = uVar12;
  this_00 = &(this->m_info_hash).v2;
  bVar19 = digest32<256L>::is_all_zeros(this_00);
  if (bVar19) {
    local_58._16_4_ = (this->m_info_hash).v1.m_number._M_elems[4];
    local_58._0_4_ = (this->m_info_hash).v1.m_number._M_elems[0];
    local_58._4_4_ = (this->m_info_hash).v1.m_number._M_elems[1];
    local_58._8_4_ = (this->m_info_hash).v1.m_number._M_elems[2];
    local_58._12_4_ = (this->m_info_hash).v1.m_number._M_elems[3];
  }
  else {
    local_58._16_4_ = (this->m_info_hash).v2.m_number._M_elems[4];
    local_58._0_4_ = (this_00->m_number)._M_elems[0];
    local_58._4_4_ = (this->m_info_hash).v2.m_number._M_elems[1];
    local_58._8_4_ = (this->m_info_hash).v2.m_number._M_elems[2];
    local_58._12_4_ = (this->m_info_hash).v2.m_number._M_elems[3];
  }
  (st->info_hash).m_number._M_elems[4] = local_58._16_4_;
  *(undefined8 *)(st->info_hash).m_number._M_elems = local_58._0_8_;
  *(ulong *)((st->info_hash).m_number._M_elems + 2) = CONCAT44(local_58._12_4_,local_58._8_4_);
  if ((flags.m_val & 0x40) != 0) {
    name_abi_cxx11_((string *)local_58,this);
    ::std::__cxx11::string::operator=((string *)&st->name,(string *)local_58);
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_,CONCAT44(local_58._20_4_,local_58._16_4_) + 1);
    }
  }
  if ((char)flags.m_val < '\0') {
    local_58._0_8_ = local_58 + 0x10;
    pcVar3 = (this->m_save_path)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar3,pcVar3 + (this->m_save_path)._M_string_length);
    ::std::__cxx11::string::operator=((string *)&st->save_path,(string *)local_58);
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_,CONCAT44(local_58._20_4_,local_58._16_4_) + 1);
    }
  }
  if ((flags.m_val & 0x20) != 0) {
    (st->torrent_file).super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(st->torrent_file).
                super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  st->has_incoming = (bool)((byte)this->field_0x5c0 >> 2 & 1);
  bVar19 = (this->m_error).failed_;
  uVar17 = *(undefined3 *)&(this->m_error).field_0x5;
  uVar9 = *(undefined4 *)&(this->m_error).cat_;
  uVar10 = *(undefined4 *)((long)&(this->m_error).cat_ + 4);
  (st->errc).val_ = (this->m_error).val_;
  (st->errc).failed_ = bVar19;
  *(undefined3 *)&(st->errc).field_0x5 = uVar17;
  *(undefined4 *)&(st->errc).cat_ = uVar9;
  *(undefined4 *)((long)&(st->errc).cat_ + 4) = uVar10;
  (st->error_file).m_val = (this->m_error_file).m_val;
  st->moving_storage = (bool)((byte)this->field_0x600 >> 5 & 1);
  st->announcing_to_trackers = (bool)(this->field_0x5c0 & 1);
  st->announcing_to_lsd = (bool)((byte)this->field_0x5c0 >> 1 & 1);
  st->announcing_to_dht = (bool)(this->field_0x5e0 & 1);
  st->added_time = this->m_added_time;
  st->completed_time = this->m_completed_time;
  st->up_bandwidth_queue = 0;
  st->down_bandwidth_queue = 0;
  st->num_peers =
       ((int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            .
                            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_torrent_hot_members).m_connections.
                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           .
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) -
       (int)((ulong)((long)(this->m_peers_to_disconnect).
                           super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_peers_to_disconnect).
                          super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4)) -
       (uint)this->m_num_connecting;
  ppVar4 = (this->super_torrent_hot_members).m_peer_list._M_t.
           super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
           .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
  if (ppVar4 == (peer_list *)0x0) {
    st->list_peers = 0;
    uVar28 = 0;
  }
  else {
    ppptVar5 = (ppVar4->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    st->list_peers =
         (int)((ulong)((long)(ppVar4->m_peers).
                             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             .
                             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)(ppVar4->m_peers).
                            super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            .
                            super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
         (int)((ulong)((long)(ppVar4->m_peers).
                             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             .
                             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)(ppVar4->m_peers).
                            super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            .
                            super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
         ((((uint)((int)ppptVar5 -
                  *(int *)&(ppVar4->m_peers).
                           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           .
                           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
         (uint)(ppptVar5 == (_Map_pointer)0x0)) * 0x40;
    uVar28 = *(uint *)&ppVar4->field_0x60 & 0x7fffffff;
  }
  st->list_seeds = uVar28;
  if (ppVar4 == (peer_list *)0x0) {
    iVar22 = 0;
  }
  else {
    iVar22 = ppVar4->m_num_connect_candidates;
  }
  st->connect_candidates = iVar22;
  iVar22 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  iVar22 = seed_rank(this,(session_settings *)CONCAT44(extraout_var,iVar22));
  st->seed_rank = iVar22;
  st->all_time_upload = this->m_total_uploaded;
  st->all_time_download = this->m_total_downloaded;
  sVar23 = finished_time(this);
  (st->finished_duration).__r = (long)sVar23.__r;
  sVar23 = active_time(this);
  (st->active_duration).__r = (long)sVar23.__r;
  sVar23 = seeding_time(this);
  (st->seeding_duration).__r = (long)sVar23.__r;
  (st->last_upload).__d.__r = (long)(this->m_last_upload).__d.__r * 1000000000;
  (st->last_download).__d.__r = (long)(this->m_last_download).__d.__r * 1000000000;
  st->storage_mode = *(uint *)&this->field_0x5c0 >> 4 & 3;
  uVar28 = *(uint *)&(this->super_torrent_hot_members).field_0x48 & 0xffffff;
  if (uVar28 == 0xffffff) {
    uVar28 = 0xffffffff;
  }
  st->num_complete = uVar28;
  uVar28 = *(uint *)&this->field_0x5dd & 0xffffff;
  if (uVar28 == 0xffffff) {
    uVar28 = 0xffffffff;
  }
  st->num_incomplete = uVar28;
  bVar19 = is_seed(this);
  st->is_seeding = bVar19;
  bVar19 = is_finished(this);
  st->is_finished = bVar19;
  st->has_metadata =
       0 < (((this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_files).m_piece_length;
  bytes_done(this,st,flags);
  lVar34 = *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                     field_0x20;
  st->total_payload_download = lVar34;
  lVar29 = *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>;
  st->total_payload_upload = lVar29;
  st->total_download =
       lVar34 + *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                          field_0x30;
  st->total_upload =
       lVar29 + *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                          field_0x10;
  st->total_failed_bytes = this->m_total_failed_bytes;
  st->total_redundant_bytes = this->m_total_redundant_bytes;
  iVar22 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x2c
  ;
  st->download_rate =
       *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x3c +
       iVar22 + *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                         field_0x5c;
  iVar30 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0xc;
  st->upload_rate =
       *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x1c +
       iVar30 + *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                         field_0x4c;
  st->download_payload_rate = iVar22;
  st->upload_payload_rate = iVar30;
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0) {
    lVar34 = (this->m_tracker_timer).impl_.implementation_.expiry.__d.__r;
    lVar29 = (long)(int)tVar21.__d.__r;
    if (SBORROW8(lVar34,lVar29 * 1000000000) != lVar34 + lVar29 * -1000000000 < 0)
    goto LAB_003363b8;
    lVar34 = lVar34 + lVar29 * -1000000000;
  }
  else {
LAB_003363b8:
    lVar34 = 0;
  }
  (st->next_announce).__r = lVar34;
  if (lVar34 < 0) {
    (st->next_announce).__r = 0;
  }
  tracker_list::last_working_url_abi_cxx11_((string *)local_58,&this->m_trackers);
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&st->current_tracker;
  ::std::__cxx11::string::operator=((string *)local_38._M_pi,(string *)local_58);
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,CONCAT44(local_58._20_4_,local_58._16_4_) + 1);
  }
  if ((st->current_tracker)._M_string_length == 0) {
    bVar19 = digest32<160L>::is_all_zeros(&(this->m_info_hash).v1);
    bVar20 = digest32<256L>::is_all_zeros(this_00);
    uVar11 = local_58._0_8_;
    phVar1 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
    plVar31 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.
              next_;
    if (plVar31 != &phVar1->super_node) {
      local_58[1] = !bVar20;
      local_58[0] = !bVar19;
      uVar18 = local_58._0_2_;
      local_58._0_8_ = uVar11;
      do {
        if (((ulong)plVar31[6].prev_ & 0x10000000000000) != 0) {
          plVar32 = plVar31[5].next_;
          plVar7 = plVar31[5].prev_;
          local_58._0_8_ = CONCAT62(local_58._2_6_,uVar18);
          lVar34 = ((long)plVar7 - (long)plVar32 >> 3) * -0x70a3d70a3d70a3d7 >> 2;
          plVar33 = plVar32;
          if (0 < lVar34) {
            plVar33 = plVar32 + lVar34 * 0x32;
            do {
              bVar19 = false;
              lVar29 = 0;
              do {
                if ((local_58[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]] ==
                     '\x01') &&
                   ((*(byte *)((long)plVar32 +
                              (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                           [lVar29] * 0x48 + 100) & 0x80) != 0)) break;
                lVar29 = lVar29 + 1;
                bVar19 = lVar29 == 2;
              } while (!bVar19);
              if (bVar19) goto LAB_003366f6;
              bVar19 = false;
              lVar29 = 0;
              do {
                if ((local_58[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]] ==
                     '\x01') &&
                   ((*(byte *)((long)plVar32 +
                              (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                           [lVar29] * 0x48 + 300) & 0x80) != 0)) break;
                lVar29 = lVar29 + 1;
                bVar19 = lVar29 == 2;
              } while (!bVar19);
              if (bVar19) {
                plVar32 = (node_ptr)&plVar32[0xc].prev_;
                goto LAB_003366f6;
              }
              bVar19 = false;
              lVar29 = 0;
              do {
                if ((local_58[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]] ==
                     '\x01') &&
                   ((*(byte *)((long)plVar32 +
                              (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                           [lVar29] * 0x48 + 500) & 0x80) != 0)) break;
                lVar29 = lVar29 + 1;
                bVar19 = lVar29 == 2;
              } while (!bVar19);
              if (bVar19) {
                plVar32 = plVar32 + 0x19;
                goto LAB_003366f6;
              }
              bVar19 = false;
              lVar29 = 0;
              do {
                if ((local_58[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]] ==
                     '\x01') &&
                   ((*(byte *)((long)plVar32 +
                              (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                           [lVar29] * 0x48 + 700) & 0x80) != 0)) break;
                lVar29 = lVar29 + 1;
                bVar19 = lVar29 == 2;
              } while (!bVar19);
              if (bVar19) {
                plVar32 = (node_ptr)&plVar32[0x25].prev_;
                goto LAB_003366f6;
              }
              plVar32 = plVar32 + 0x32;
              bVar19 = 1 < lVar34;
              lVar34 = lVar34 + -1;
            } while (bVar19);
          }
          lVar34 = ((long)plVar7 - (long)plVar33 >> 3) * -0x70a3d70a3d70a3d7;
          if (lVar34 == 1) {
LAB_00336699:
            bVar19 = false;
            lVar34 = 0;
            do {
              if ((local_58[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar34]] ==
                   '\x01') &&
                 ((*(byte *)((long)plVar33 +
                            (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar34]
                            * 0x48 + 100) & 0x80) != 0)) break;
              lVar34 = lVar34 + 1;
              bVar19 = lVar34 == 2;
            } while (!bVar19);
            plVar32 = plVar33;
            if (!bVar19) {
              plVar32 = plVar7;
            }
          }
          else if (lVar34 == 2) {
LAB_0033665d:
            bVar19 = false;
            lVar34 = 0;
            do {
              if ((local_58[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar34]] ==
                   '\x01') &&
                 ((*(byte *)((long)plVar33 +
                            (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar34]
                            * 0x48 + 100) & 0x80) != 0)) break;
              lVar34 = lVar34 + 1;
              bVar19 = lVar34 == 2;
            } while (!bVar19);
            plVar32 = plVar33;
            if (!bVar19) {
              plVar33 = (node_ptr)&plVar33[0xc].prev_;
              goto LAB_00336699;
            }
          }
          else {
            plVar32 = plVar7;
            if (lVar34 == 3) {
              bVar19 = false;
              lVar34 = 0;
              do {
                if ((local_58[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar34]] ==
                     '\x01') &&
                   ((*(byte *)((long)plVar33 +
                              (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                           [lVar34] * 0x48 + 100) & 0x80) != 0)) break;
                lVar34 = lVar34 + 1;
                bVar19 = lVar34 == 2;
              } while (!bVar19);
              plVar32 = plVar33;
              if (!bVar19) {
                plVar33 = (node_ptr)&plVar33[0xc].prev_;
                goto LAB_0033665d;
              }
            }
          }
LAB_003366f6:
          if (plVar32 == plVar7) {
            ::std::__cxx11::string::_M_assign((string *)local_38._M_pi);
            break;
          }
        }
        plVar31 = plVar31->next_;
      } while (plVar31 != &phVar1->super_node);
    }
  }
  if ((flags.m_val & 0x10) != 0) {
    if (&this->m_verified != &st->verified_pieces) {
      _Var6._M_head_impl =
           *(uint **)&(this->m_verified).super_bitfield.m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      piVar26 = (int *)(_Var6._M_head_impl + 1);
      if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var6._M_head_impl ==
          (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
        uVar28 = 0;
        piVar26 = (int *)0x0;
      }
      else {
        uVar28 = *_Var6._M_head_impl;
      }
      bitfield::assign(&(st->verified_pieces).super_bitfield,(char *)piVar26,uVar28);
    }
  }
  st->num_uploads = *(uint *)&this->field_0x5d8 & 0xffffff;
  uVar28 = (uint)*(uint3 *)&this->field_0x5d4;
  if (uVar28 == 0xffffff) {
    uVar28 = 0xffffffff;
  }
  st->uploads_limit = uVar28;
  st->num_connections =
       (int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           .
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_torrent_hot_members).m_connections.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) -
       (int)((ulong)((long)(this->m_peers_to_disconnect).
                           super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_peers_to_disconnect).
                          super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  uVar28 = (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21) &
           0xffffff;
  if (uVar28 == 0xffffff) {
    uVar28 = 0xffffffff;
  }
  st->connections_limit = uVar28;
  (st->queue_position).m_val = (this->m_sequence_number).m_val;
  st->need_save_resume = (this->m_need_save_resume_data).m_val != '\0';
  (st->need_save_resume_data).m_val = (this->m_need_save_resume_data).m_val;
  st->state = (state_t)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39)
              & checking_resume_data;
  tVar25 = torrent::flags(this);
  (st->flags).m_val = tVar25.m_val;
  peVar8 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar22 = (peVar8->m_files).m_piece_length;
  if (iVar22 < 1) {
    st->state = downloading_metadata;
    st->progress_ppm = *(uint3 *)&this->field_0x604 & 0xfffff;
    st->progress = (float)(*(uint3 *)&this->field_0x604 & 0xfffff) / 1e+06;
    st->block_size = 0;
    return;
  }
  iVar30 = 0x4000;
  if (iVar22 < 0x4000) {
    iVar30 = iVar22;
  }
  st->block_size = iVar30;
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xe00000000000000) ==
      0x200000000000000) {
    st->progress_ppm = *(uint3 *)&this->field_0x604 & 0xfffff;
    uVar28 = *(uint3 *)&this->field_0x604 & 0xfffff;
LAB_003368f0:
    fVar35 = (float)(int)uVar28 / 1e+06;
  }
  else {
    if (st->total_wanted != 0) {
      uVar28 = (uint)((st->total_wanted_done * 1000000) / st->total_wanted);
      st->progress_ppm = uVar28;
      goto LAB_003368f0;
    }
    st->progress_ppm = 1000000;
    fVar35 = 1.0;
  }
  st->progress = fVar35;
  if ((flags.m_val & 8) != 0) {
    iVar22 = (peVar8->m_files).m_num_pieces;
    if ((this->super_torrent_hot_members).m_picker._M_t.
        super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
        ._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
        .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl ==
        (piece_picker *)0x0) {
      bitfield::resize(&(st->pieces).super_bitfield,iVar22,
                       (bool)((byte)((uint)*(undefined4 *)
                                            &(this->super_torrent_hot_members).field_0x48 >> 0x1e) &
                             1));
    }
    else {
      uVar28 = 0;
      bitfield::resize(&(st->pieces).super_bitfield,iVar22,false);
      _Var6._M_head_impl =
           *(uint **)&(st->pieces).super_bitfield.m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var6._M_head_impl !=
          (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
        uVar28 = *_Var6._M_head_impl;
      }
      if (uVar28 != 0) {
        index.m_val = 0;
        do {
          bVar19 = piece_picker::has_piece_passed
                             ((this->super_torrent_hot_members).m_picker._M_t.
                              super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                              _M_head_impl,index);
          if (bVar19) {
            uVar24 = 0x80000000 >> ((byte)index.m_val & 0x1f);
            puVar2 = (uint *)((long)(st->pieces).super_bitfield.m_buf.
                                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                              + 4 + (ulong)((uint)index.m_val >> 5) * 4);
            *puVar2 = *puVar2 | uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                                uVar24 << 0x18;
          }
          index.m_val = index.m_val + 1;
        } while (uVar28 != index.m_val);
      }
    }
  }
  this_01._M_head_impl =
       (this->super_torrent_hot_members).m_picker._M_t.
       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
  if (this_01._M_head_impl == (piece_picker *)0x0) {
    iVar22 = 0;
    if (((this->super_torrent_hot_members).field_0x4b & 0x40) == 0) goto LAB_003369c4;
    piVar26 = &(((this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_files).m_num_pieces;
  }
  else {
    piVar26 = &(this_01._M_head_impl)->m_num_passed;
  }
  iVar22 = *piVar26;
LAB_003369c4:
  st->num_pieces = iVar22;
  st->num_seeds = (uint)this->m_num_seeds - (uint)this->m_num_connecting_seeds;
  if ((flags.m_val & 1) == 0 || this_01._M_head_impl == (piece_picker *)0x0) {
    st->distributed_full_copies = -1;
    st->distributed_fraction = -1;
    fVar35 = -1.0;
  }
  else {
    pVar27 = piece_picker::distributed_copies(this_01._M_head_impl);
    st->distributed_full_copies = pVar27.first;
    st->distributed_fraction = pVar27.second;
    fVar35 = (float)pVar27.second / 1000.0 + (float)pVar27.first;
  }
  st->distributed_copies = fVar35;
  st->last_seen_complete = this->m_swarm_last_seen_complete;
  return;
}

Assistant:

void torrent::status(torrent_status* st, status_flags_t const flags)
	{
		INVARIANT_CHECK;

		time_point32 const now = aux::time_now32();

		st->handle = get_handle();
		st->info_hashes = info_hash();
#if TORRENT_ABI_VERSION < 3
		st->info_hash = info_hash().get_best();
#endif
#if TORRENT_ABI_VERSION == 1
		st->is_loaded = true;
#endif

		if (flags & torrent_handle::query_name)
			st->name = name();

		if (flags & torrent_handle::query_save_path)
			st->save_path = save_path();

		if (flags & torrent_handle::query_torrent_file)
			st->torrent_file = m_torrent_file;

		st->has_incoming = m_has_incoming;
		st->errc = m_error;
		st->error_file = m_error_file;

#if TORRENT_ABI_VERSION == 1
		if (m_error) st->error = m_error.message()
			+ ": " + resolve_filename(m_error_file);
		st->seed_mode = m_seed_mode;
#endif
		st->moving_storage = m_moving_storage;

		st->announcing_to_trackers = m_announce_to_trackers;
		st->announcing_to_lsd = m_announce_to_lsd;
		st->announcing_to_dht = m_announce_to_dht;
#if TORRENT_ABI_VERSION == 1
		st->stop_when_ready = m_stop_when_ready;
#endif

		st->added_time = m_added_time;
		st->completed_time = m_completed_time;

#if TORRENT_ABI_VERSION == 1
		st->last_scrape = static_cast<int>(total_seconds(now - m_last_scrape));
#endif

#if TORRENT_ABI_VERSION == 1
#ifndef TORRENT_DISABLE_SHARE_MODE
		st->share_mode = m_share_mode;
#else
		st->share_mode = false;
#endif
		st->upload_mode = m_upload_mode;
#endif
		st->up_bandwidth_queue = 0;
		st->down_bandwidth_queue = 0;
#if TORRENT_ABI_VERSION == 1
		st->priority = priority();
#endif

		st->num_peers = num_peers() - m_num_connecting;

		st->list_peers = m_peer_list ? m_peer_list->num_peers() : 0;
		st->list_seeds = m_peer_list ? m_peer_list->num_seeds() : 0;
		st->connect_candidates = m_peer_list ? m_peer_list->num_connect_candidates() : 0;
		TORRENT_ASSERT(st->connect_candidates >= 0);
		st->seed_rank = seed_rank(settings());

		st->all_time_upload = m_total_uploaded;
		st->all_time_download = m_total_downloaded;

		// activity time
#if TORRENT_ABI_VERSION == 1
		st->finished_time = int(total_seconds(finished_time()));
		st->active_time = int(total_seconds(active_time()));
		st->seeding_time = int(total_seconds(seeding_time()));

		time_point32 const unset{seconds32(0)};

		st->time_since_upload = m_last_upload == unset ? -1
			: static_cast<int>(total_seconds(now - m_last_upload));
		st->time_since_download = m_last_download == unset ? -1
			: static_cast<int>(total_seconds(now - m_last_download));
#endif

		st->finished_duration = finished_time();
		st->active_duration = active_time();
		st->seeding_duration = seeding_time();

		st->last_upload = m_last_upload;
		st->last_download = m_last_download;

		st->storage_mode = static_cast<storage_mode_t>(m_storage_mode);

		st->num_complete = (m_complete == 0xffffff) ? -1 : m_complete;
		st->num_incomplete = (m_incomplete == 0xffffff) ? -1 : m_incomplete;
#if TORRENT_ABI_VERSION == 1
		st->paused = is_torrent_paused();
		st->auto_managed = m_auto_managed;
		st->sequential_download = m_sequential_download;
#endif
		st->is_seeding = is_seed();
		st->is_finished = is_finished();
#if TORRENT_ABI_VERSION == 1
#ifndef TORRENT_DISABLE_SUPERSEEDING
		st->super_seeding = m_super_seeding;
#endif
#endif
		st->has_metadata = valid_metadata();
		bytes_done(*st, flags);
		TORRENT_ASSERT(st->total_wanted_done >= 0);
		TORRENT_ASSERT(st->total_done >= st->total_wanted_done);

		// payload transfer
		st->total_payload_download = m_stat.total_payload_download();
		st->total_payload_upload = m_stat.total_payload_upload();

		// total transfer
		st->total_download = m_stat.total_payload_download()
			+ m_stat.total_protocol_download();
		st->total_upload = m_stat.total_payload_upload()
			+ m_stat.total_protocol_upload();

		// failed bytes
		st->total_failed_bytes = m_total_failed_bytes;
		st->total_redundant_bytes = m_total_redundant_bytes;

		// transfer rate
		st->download_rate = m_stat.download_rate();
		st->upload_rate = m_stat.upload_rate();
		st->download_payload_rate = m_stat.download_payload_rate();
		st->upload_payload_rate = m_stat.upload_payload_rate();

		if (is_paused() || m_tracker_timer.expiry() < now)
			st->next_announce = seconds(0);
		else
			st->next_announce = m_tracker_timer.expiry() - now;

		if (st->next_announce.count() < 0)
			st->next_announce = seconds(0);

#if TORRENT_ABI_VERSION == 1
		st->announce_interval = seconds(0);
#endif

		st->current_tracker = m_trackers.last_working_url();
		if (st->current_tracker.empty())
		{
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
			aux::array<bool const, num_protocols, protocol_version> const supports_protocol{
			{
				m_info_hash.has_v1(),
				m_info_hash.has_v2()
			}};
#ifdef __clang__
#pragma clang diagnostic pop
#endif

			for (auto const& t : m_trackers)
			{
				if (!t.verified) continue;
				if (std::any_of(t.endpoints.begin(), t.endpoints.end()
					, [supports_protocol](aux::announce_endpoint const& aep) {
						for (protocol_version const ih : all_versions)
						{
							if (supports_protocol[ih] && aep.info_hashes[ih].updating)
								return false;
						}
						return true;
					})) continue;
				st->current_tracker = t.url;
				break;
			}
		}

		if ((flags & torrent_handle::query_verified_pieces))
		{
			st->verified_pieces = m_verified;
		}

		st->num_uploads = m_num_uploads;
		st->uploads_limit = m_max_uploads == (1 << 24) - 1 ? -1 : m_max_uploads;
		st->num_connections = num_peers();
		st->connections_limit = m_max_connections == (1 << 24) - 1 ? -1 : m_max_connections;
		// if we don't have any metadata, stop here

		st->queue_position = queue_position();
#if TORRENT_ABI_VERSION < 4
		st->need_save_resume = bool(m_need_save_resume_data);
#endif
		st->need_save_resume_data = m_need_save_resume_data;
#if TORRENT_ABI_VERSION == 1
		st->ip_filter_applies = m_apply_ip_filter;
#endif

		st->state = static_cast<torrent_status::state_t>(m_state);
		st->flags = this->flags();

#if TORRENT_USE_ASSERTS
		if (st->state == torrent_status::finished
			|| st->state == torrent_status::seeding)
		{
			// it may be tempting to assume that st->is_finished == true here, but
			// this assumption does not always hold. We transition to "finished"
			// when we receive the last block of the last piece, which is before
			// the hash check comes back. "is_finished" is set to true once all the
			// pieces have been hash checked. So, there's a short window where it
			// doesn't hold.
		}
#endif

		if (!valid_metadata())
		{
			st->state = torrent_status::downloading_metadata;
			st->progress_ppm = m_progress_ppm;
#if !TORRENT_NO_FPU
			st->progress = m_progress_ppm / 1000000.f;
#endif
			st->block_size = 0;
			return;
		}

		st->block_size = block_size();

		if (m_state == torrent_status::checking_files)
		{
			st->progress_ppm = m_progress_ppm;
#if !TORRENT_NO_FPU
			st->progress = m_progress_ppm / 1000000.f;
#endif
		}
		else if (st->total_wanted == 0)
		{
			st->progress_ppm = 1000000;
			st->progress = 1.f;
		}
		else
		{
			st->progress_ppm = int(st->total_wanted_done * 1000000
				/ st->total_wanted);
#if !TORRENT_NO_FPU
			st->progress = float(st->progress_ppm) / 1000000.f;
#endif
		}

		if (flags & torrent_handle::query_pieces)
		{
			int const num_pieces = m_torrent_file->num_pieces();
			if (has_picker())
			{
				st->pieces.resize(num_pieces, false);
				for (auto const i : st->pieces.range())
					if (m_picker->has_piece_passed(i)) st->pieces.set_bit(i);
			}
			else if (m_have_all)
			{
				st->pieces.resize(num_pieces, true);
			}
			else
			{
				st->pieces.resize(num_pieces, false);
			}
		}
		st->num_pieces = num_passed();
#if TORRENT_USE_INVARIANT_CHECKS
		{
			// The documentation states that `num_pieces` is the count of number
			// of bits set in `pieces`. Ensure that invariant holds.
			int num_have_pieces = 0;
			if (has_picker())
			{
				for (auto const i : m_torrent_file->piece_range())
					if (m_picker->has_piece_passed(i)) ++num_have_pieces;
			}
			else if (m_have_all)
			{
				num_have_pieces = m_torrent_file->num_pieces();
			}
			TORRENT_ASSERT(num_have_pieces == st->num_pieces);
		}
#endif
		st->num_seeds = num_seeds();
		if ((flags & torrent_handle::query_distributed_copies) && m_picker.get())
		{
			std::tie(st->distributed_full_copies, st->distributed_fraction) =
				m_picker->distributed_copies();
#if TORRENT_NO_FPU
			st->distributed_copies = -1.f;
#else
			st->distributed_copies = float(st->distributed_full_copies)
				+ float(st->distributed_fraction) / 1000;
#endif
		}
		else
		{
			st->distributed_full_copies = -1;
			st->distributed_fraction = -1;
			st->distributed_copies = -1.f;
		}

		st->last_seen_complete = m_swarm_last_seen_complete;
	}